

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_codec.c
# Opt level: O0

char * aom_obu_type_to_string(OBU_TYPE type)

{
  OBU_TYPE type_local;
  char *local_8;
  
  switch(type) {
  case OBU_SEQUENCE_HEADER:
    local_8 = "OBU_SEQUENCE_HEADER";
    break;
  case OBU_TEMPORAL_DELIMITER:
    local_8 = "OBU_TEMPORAL_DELIMITER";
    break;
  case OBU_FRAME_HEADER:
    local_8 = "OBU_FRAME_HEADER";
    break;
  case OBU_TILE_GROUP:
    local_8 = "OBU_TILE_GROUP";
    break;
  case OBU_METADATA:
    local_8 = "OBU_METADATA";
    break;
  case OBU_FRAME:
    local_8 = "OBU_FRAME";
    break;
  case OBU_REDUNDANT_FRAME_HEADER:
    local_8 = "OBU_REDUNDANT_FRAME_HEADER";
    break;
  case OBU_TILE_LIST:
    local_8 = "OBU_TILE_LIST";
    break;
  default:
    local_8 = "<Invalid OBU Type>";
    break;
  case OBU_PADDING:
    local_8 = "OBU_PADDING";
  }
  return local_8;
}

Assistant:

const char *aom_obu_type_to_string(OBU_TYPE type) {
  switch (type) {
    case OBU_SEQUENCE_HEADER: return "OBU_SEQUENCE_HEADER";
    case OBU_TEMPORAL_DELIMITER: return "OBU_TEMPORAL_DELIMITER";
    case OBU_FRAME_HEADER: return "OBU_FRAME_HEADER";
    case OBU_REDUNDANT_FRAME_HEADER: return "OBU_REDUNDANT_FRAME_HEADER";
    case OBU_FRAME: return "OBU_FRAME";
    case OBU_TILE_GROUP: return "OBU_TILE_GROUP";
    case OBU_METADATA: return "OBU_METADATA";
    case OBU_TILE_LIST: return "OBU_TILE_LIST";
    case OBU_PADDING: return "OBU_PADDING";
    default: break;
  }
  return "<Invalid OBU Type>";
}